

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

uint32_t doctest::anon_unknown_14::anon_unknown_34::headerValue(uchar c)

{
  byte in_DIL;
  logic_error *this;
  logic_error local_18 [20];
  uint local_4;
  
  if ((in_DIL & 0xe0) == 0xc0) {
    local_4 = in_DIL & 0x1f;
  }
  else if ((in_DIL & 0xf0) == 0xe0) {
    local_4 = in_DIL & 0xf;
  }
  else {
    if ((in_DIL & 0xf8) != 0xf0) {
      this = local_18;
      std::logic_error::logic_error
                (this,
                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]read-excel/test/string/../../test/doctest/doctest.h:4906: Internal doctest error: Invalid multibyte utf-8 start byte encountered"
                );
      throw_exception<std::logic_error>(this);
    }
    local_4 = in_DIL & 7;
  }
  return local_4;
}

Assistant:

uint32_t headerValue(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return c & 0x1F;
        }
        if ((c & 0xF0) == 0xE0) {
            return c & 0x0F;
        }
        if ((c & 0xF8) == 0xF0) {
            return c & 0x07;
        }
        DOCTEST_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }